

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestList
               (ostream *stream,
               vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  bool bVar1;
  const_iterator stream_00;
  const_iterator element_name;
  reference ppTVar2;
  ostream *poVar3;
  size_type sVar4;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *in_RSI;
  ostream *in_RDI;
  size_t i;
  TestSuite *test_suite;
  const_iterator __end2;
  const_iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int total_tests;
  string kIndent;
  string kTestsuites;
  TestSuite *in_stack_000001f8;
  ostream *in_stack_00000200;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *in_stack_fffffffffffffe78;
  __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffea8;
  allocator<char> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ulong local_110;
  undefined1 local_101 [40];
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [15];
  undefined1 in_stack_ffffffffffffff5f;
  string *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  TestSuite *in_stack_ffffffffffffff70;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::allocator<char>::~allocator(&local_31);
  Indent_abi_cxx11_(in_stack_fffffffffffffea8);
  std::operator<<(local_8,"{\n");
  stream_00 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                        (in_stack_fffffffffffffe78);
  element_name = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                           (in_stack_fffffffffffffe78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffe80,
                       (__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*((__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                           *)&stack0xffffffffffffff80);
    in_stack_ffffffffffffff70 = *ppTVar2;
    TestSuite::total_test_count((TestSuite *)0x135b53);
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++((__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                  *)&stack0xffffffffffffff80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  OutputJsonKey((ostream *)stream_00._M_current,(string *)element_name._M_current,
                (string *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  OutputJsonKey((ostream *)stream_00._M_current,(string *)element_name._M_current,
                (string *)in_stack_ffffffffffffff70,
                (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  std::__cxx11::string::~string((string *)(local_101 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  poVar3 = std::operator<<(local_8,local_68);
  poVar3 = std::operator<<(poVar3,"\"");
  poVar3 = std::operator<<(poVar3,local_30);
  std::operator<<(poVar3,"\": [\n");
  local_110 = 0;
  while( true ) {
    sVar4 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::size(local_10)
    ;
    if (sVar4 <= local_110) break;
    if (local_110 != 0) {
      std::operator<<(local_8,",\n");
    }
    std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::operator[]
              (local_10,local_110);
    PrintJsonTestSuite(in_stack_00000200,in_stack_000001f8);
    local_110 = local_110 + 1;
  }
  poVar3 = std::operator<<(local_8,"\n");
  poVar3 = std::operator<<(poVar3,local_68);
  poVar3 = std::operator<<(poVar3,"]\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestList(
    std::ostream* stream, const std::vector<TestSuite*>& test_suites) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";
  int total_tests = 0;
  for (auto test_suite : test_suites) {
    total_tests += test_suite->total_test_count();
  }
  OutputJsonKey(stream, kTestsuites, "tests", total_tests, kIndent);

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  for (size_t i = 0; i < test_suites.size(); ++i) {
    if (i != 0) {
      *stream << ",\n";
    }
    PrintJsonTestSuite(stream, *test_suites[i]);
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}